

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

void __thiscall QScrollBar::initStyleOption(QScrollBar *this,QStyleOptionSlider *option)

{
  long lVar1;
  int iVar2;
  QScrollBarPrivate *pQVar3;
  QStyle *pQVar4;
  QWidget *in_RSI;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QScrollBarPrivate *d;
  undefined4 in_stack_ffffffffffffffc8;
  SubControl in_stack_ffffffffffffffcc;
  QStyleOption *this_00;
  undefined4 local_10;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QWidget *)0x0) {
    this_00 = in_RDI;
    pQVar3 = d_func((QScrollBar *)0x67b521);
    QStyleOption::initFrom(this_00,in_RSI);
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)in_RDI,in_stack_ffffffffffffffcc);
    *(undefined4 *)&in_RSI[1].field_0x18 = local_c;
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)in_RDI,in_stack_ffffffffffffffcc);
    *(undefined4 *)&in_RSI[1].field_0x1c = local_10;
    *(Orientation *)&in_RSI[1].data = (pQVar3->super_QAbstractSliderPrivate).orientation;
    *(undefined4 *)((long)&in_RSI[1].data + 4) =
         *(undefined4 *)&(pQVar3->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254;
    *(int *)(in_RSI + 2) = (pQVar3->super_QAbstractSliderPrivate).maximum;
    *(int *)&in_RSI[2].super_QPaintDevice = (pQVar3->super_QAbstractSliderPrivate).position;
    *(int *)&in_RSI[2].field_0x14 = (pQVar3->super_QAbstractSliderPrivate).value;
    *(int *)&in_RSI[2].field_0x18 = (pQVar3->super_QAbstractSliderPrivate).singleStep;
    *(int *)&in_RSI[2].field_0x1c = (pQVar3->super_QAbstractSliderPrivate).pageStep;
    in_RSI[2].field_0xc = ((byte)(pQVar3->super_QAbstractSliderPrivate).field_0x27c >> 3 & 1) != 0;
    if ((pQVar3->super_QAbstractSliderPrivate).orientation == Horizontal) {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_Horizontal);
    }
    if (((pQVar3->flashed & 1U) != 0) || ((pQVar3->transient & 1U) == 0)) {
      pQVar4 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x60,in_RSI,in_RDI,0);
      if (iVar2 != 0) {
        QFlags<QStyle::StateFlag>::operator|=
                  ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_On);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollBar::initStyleOption(QStyleOptionSlider *option) const
{
    if (!option)
        return;

    Q_D(const QScrollBar);
    option->initFrom(this);
    option->subControls = QStyle::SC_None;
    option->activeSubControls = QStyle::SC_None;
    option->orientation = d->orientation;
    option->minimum = d->minimum;
    option->maximum = d->maximum;
    option->sliderPosition = d->position;
    option->sliderValue = d->value;
    option->singleStep = d->singleStep;
    option->pageStep = d->pageStep;
    option->upsideDown = d->invertedAppearance;
    if (d->orientation == Qt::Horizontal)
        option->state |= QStyle::State_Horizontal;
    if ((d->flashed || !d->transient) && style()->styleHint(QStyle::SH_ScrollBar_Transient, option, this))
        option->state |= QStyle::State_On;
}